

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t * Gia_SimAbsFind(Vec_Int_t *vValues,int Value)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  long lVar3;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  iVar1 = vValues->nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (vValues->pArray[lVar3] == Value) {
        Vec_IntPush(p,(int)lVar3);
        iVar1 = vValues->nSize;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_SimAbsFind( Vec_Int_t * vValues, int Value )
{
    Vec_Int_t * vSubset = Vec_IntAlloc( 100 ); int i, Entry;
    Vec_IntForEachEntry( vValues, Entry, i )
        if ( Entry == Value )
            Vec_IntPush( vSubset, i );
    return vSubset;
}